

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall xray_re::cse_alife_helicopter::state_read(cse_alife_helicopter *this)

{
  uint16_t in_DX;
  xr_packet *in_RSI;
  
  state_read((cse_alife_helicopter *)
             ((long)&this[-1].super_cse_alife_dynamic_object_visual.super_cse_alife_dynamic_object.
                     super_cse_alife_object.super_cse_abstract.m_s_name.field_2 + 8),in_RSI,in_DX);
  return;
}

Assistant:

void cse_alife_helicopter::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_dynamic_object_visual::state_read(packet, size);
	cse_motion::motion_read(packet);
	if (m_version >= CSE_VERSION_0x45)
		cse_ph_skeleton::state_read(packet, size);
	packet.r_sz(cse_visual::m_startup_animation);
	packet.r_sz(m_engine_sound);
}